

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall SubcommandProgram_Working_Test::TestBody(SubcommandProgram_Working_Test *this)

{
  reference rhs;
  char *pcVar1;
  long lVar2;
  AssertHelper AStack_98;
  allocator local_89;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string((string *)&gtest_ar,"-d",(allocator *)&gtest_ar_1);
  std::__cxx11::string::string(local_58,"start",(allocator *)&AStack_98);
  std::__cxx11::string::string(local_38,"-ffilename",&local_89);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_SubcommandProgram).super_TApp.args,&gtest_ar,&stack0xffffffffffffffe8);
  lVar2 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  TApp::run((TApp *)this);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","dummy",(int *)&gtest_ar_1,
             &(this->super_SubcommandProgram).dummy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1c0,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&gtest_ar,
             &(this->super_SubcommandProgram).super_TApp.app,true);
  rhs = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at
                  ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&gtest_ar,0);
  testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
            ((internal *)&gtest_ar_1,"start","app.get_subcommands().at(0)",
             &(this->super_SubcommandProgram).start,rhs);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base
            ((_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1c1,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"filename\"","file",(char (*) [9])0x142b5e,
             &(this->super_SubcommandProgram).file);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1c2,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SubcommandProgram, Working) {
    args = {"-d", "start", "-ffilename"};

    run();

    EXPECT_EQ(1, dummy);
    EXPECT_EQ(start, app.get_subcommands().at(0));
    EXPECT_EQ("filename", file);
}